

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

void cloudSupport(CloudManager *dd,CloudNode *n,int *support)

{
  uint uVar1;
  int *extraout_RDX;
  
  while( true ) {
    uVar1 = dd->bitsNode;
    if (((uVar1 & 0xefffffff) == 0xfffffff) || ((uVar1 & 0x10000000) != 0)) break;
    dd->bitsNode = uVar1 | 0x10000000;
    *(undefined4 *)((long)&n[0x2aaaaaa].t + (ulong)uVar1 * 4) = 1;
    cloudSupport(*(CloudManager **)(dd->bitsCache + 2),n,support);
    dd = (CloudManager *)(*(ulong *)dd->bitsCache & 0xfffffffffffffffe);
    support = extraout_RDX;
  }
  return;
}

Assistant:

static void cloudSupport( CloudManager * dd, CloudNode * n, int * support )
{
    if ( cloudIsConstant(n) || cloudNodeIsMarked(n) )
        return;
    // set visited flag
    cloudNodeMark(n);
    support[cloudV(n)] = 1;
    cloudSupport( dd, cloudT(n), support );
    cloudSupport( dd, Cloud_Regular(cloudE(n)), support );
}